

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O2

bool __thiscall
libcellml::ComponentEntity::containsComponent
          (ComponentEntity *this,string *name,bool searchEncapsulated)

{
  const_iterator cVar1;
  EntityImpl *pEVar2;
  size_t i;
  ulong uVar3;
  bool bVar4;
  ComponentEntity local_40;
  
  cVar1 = ComponentEntityImpl::findComponent
                    ((ComponentEntityImpl *)
                     (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,name);
  pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  bVar4 = cVar1._M_current !=
          *(shared_ptr<libcellml::Component> **)((long)&pEVar2[2].mId.field_2 + 8);
  if (searchEncapsulated && !bVar4) {
    bVar4 = false;
    for (uVar3 = 0;
        (bVar4 == false &&
        (uVar3 < (ulong)((long)((long)cVar1._M_current - pEVar2[2].mId.field_2._M_allocated_capacity
                               ) >> 4))); uVar3 = uVar3 + 1) {
      component(&local_40,(size_t)this);
      bVar4 = containsComponent((ComponentEntity *)
                                local_40.super_NamedEntity.super_ParentedEntity.super_Entity.
                                _vptr_Entity,name,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      cVar1._M_current = *(shared_ptr<libcellml::Component> **)((long)&pEVar2[2].mId.field_2 + 8);
    }
  }
  return bVar4;
}

Assistant:

bool ComponentEntity::containsComponent(const std::string &name, bool searchEncapsulated) const
{
    bool status = false;
    auto result = pFunc()->findComponent(name);
    if (result != pFunc()->mComponents.end()) {
        status = true;
    } else if (searchEncapsulated) {
        for (size_t i = 0; i < componentCount() && !status; ++i) {
            status = component(i)->containsComponent(name, searchEncapsulated);
        }
    }

    return status;
}